

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlFatalErrMsgStrIntStr
               (xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,int val,
               xmlChar *str2)

{
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,(char *)str1,(char *)str2,
                    (char *)0x0,val,0,msg,str1,val,str2);
  }
  else if ((ctxt->disableSAX == 0) || (ctxt->instate != XML_PARSER_EOF)) {
    ctxt->errNo = error;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                    (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,(char *)str1,(char *)str2,
                    (char *)0x0,val,0,msg,str1,val,str2);
    ctxt->wellFormed = 0;
    if (ctxt->recovery == 0) {
      ctxt->disableSAX = 1;
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlFatalErrMsgStrIntStr(xmlParserCtxtPtr ctxt, xmlParserErrors error,
                  const char *msg, const xmlChar *str1, int val,
		  const xmlChar *str2)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL)
	ctxt->errNo = error;
    __xmlRaiseError(NULL, NULL, NULL,
                    ctxt, NULL, XML_FROM_PARSER, error, XML_ERR_FATAL,
                    NULL, 0, (const char *) str1, (const char *) str2,
		    NULL, val, 0, msg, str1, val, str2);
    if (ctxt != NULL) {
	ctxt->wellFormed = 0;
	if (ctxt->recovery == 0)
	    ctxt->disableSAX = 1;
    }